

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O3

Promise<void> __thiscall
capnp::LocalClient::callInternal
          (LocalClient *this,uint64_t interfaceId,uint16_t methodId,CallContextHook *context)

{
  undefined8 *puVar1;
  BlockedCall *this_00;
  undefined8 uVar2;
  Disposer *pDVar3;
  OwnPromiseNode node;
  long *plVar4;
  PromiseBase node_00;
  char *pcVar5;
  size_t sVar6;
  undefined6 in_register_00000012;
  long *in_R8;
  LocalClient *c;
  DebugExpression<bool> _kjCondition;
  Fault f;
  undefined1 local_210 [16];
  Own<capnp::LocalClient,_std::nullptr_t> local_200;
  OwnPromiseNode local_1f0;
  anon_class_8_1_8991fb9c_for_errorHandler local_1e8;
  long *local_1e0;
  PromiseBase local_1d8;
  char *local_1d0;
  char *pcStack_1c8;
  undefined8 local_1c0;
  Exception local_1b8;
  
  local_200.disposer =
       (Disposer *)(CONCAT71(local_200.disposer._1_7_,*(char *)(interfaceId + 0x78)) ^ 1);
  if (*(char *)(interfaceId + 0x78) != '\0') {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
              ((Fault *)&local_1b8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++"
               ,0x358,FAILED,"!blocked","_kjCondition,",(DebugExpression<bool> *)(local_210 + 0x10))
    ;
    kj::_::Debug::Fault::fatal((Fault *)&local_1b8);
  }
  if (*(char *)(interfaceId + 0x80) == '\x01') {
    kj::Exception::Exception(&local_1b8,(Exception *)(interfaceId + 0x88));
    kj::_::PromiseDisposer::
    alloc<kj::_::ImmediateBrokenPromiseNode,kj::_::PromiseDisposer,kj::Exception>
              ((PromiseDisposer *)this,&local_1b8);
    kj::Exception::~Exception(&local_1b8);
  }
  else {
    puVar1 = *(undefined8 **)(interfaceId + 0x28);
    if (puVar1 == (undefined8 *)0x0) {
      local_210._0_8_ = (Exception *)0x0;
      local_1b8.ownFile.content.ptr = (char *)0x0;
      local_1b8.ownFile.content.size_ = 0;
      kj::_::Debug::Fault::init
                ((Fault *)local_210,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)local_210);
    }
    (**(code **)*puVar1)
              (local_210 + 0x10,puVar1,CONCAT62(in_register_00000012,methodId),
               (ulong)context & 0xffff);
    if (*(char *)(interfaceId + 0x68) == '\x01') {
      local_1d8.node.ptr = (OwnPromiseNode)(OwnPromiseNode)local_200.disposer;
      local_200.disposer = (Disposer *)0x0;
      kj::_::PromiseDisposer::
      alloc<kj::_::AdapterPromiseNode<kj::_::Void,kj::Canceler::AdapterImpl<void>>,kj::_::PromiseDisposer,kj::Canceler&,kj::Promise<void>>
                ((PromiseDisposer *)&local_1b8,(Canceler *)(interfaceId + 0x70),
                 (Promise<void> *)&local_1d8);
      pDVar3 = local_200.disposer;
      local_200.disposer = (Disposer *)local_1b8.ownFile.content.ptr;
      local_1b8.ownFile.content.ptr = (char *)0x0;
      if ((PromiseArenaMember *)pDVar3 != (PromiseArenaMember *)0x0) {
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pDVar3);
        pcVar5 = local_1b8.ownFile.content.ptr;
        if ((PromiseArenaMember *)local_1b8.ownFile.content.ptr != (PromiseArenaMember *)0x0) {
          local_1b8.ownFile.content.ptr = (char *)0x0;
          kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pcVar5);
        }
      }
      node_00.node.ptr = local_1d8.node.ptr;
      if (local_1d8.node.ptr != (PromiseNode *)0x0) {
        local_1d8.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node_00.node.ptr);
      }
    }
    if (local_200.ptr._1_1_ == '\0') {
      *(int *)(interfaceId + 0x18) = *(int *)(interfaceId + 0x18) + 1;
      local_210._0_8_ = interfaceId + 0x10;
      local_210._8_8_ = interfaceId;
      (**(code **)(*in_R8 + 0x38))(&local_1e8);
      kj::Promise<void>::
      attach<kj::Own<capnp::LocalClient,decltype(nullptr)>,kj::Own<capnp::CallContextHook,decltype(nullptr)>>
                ((Promise<void> *)&local_1f0,
                 (Own<capnp::LocalClient,_std::nullptr_t> *)(local_210 + 0x10),
                 (Own<capnp::CallContextHook,_std::nullptr_t> *)local_210);
      local_1d0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++"
      ;
      pcStack_1c8 = "callInternal";
      local_1c0._0_4_ = 0x369;
      local_1c0._4_4_ = 0x13;
      kj::Promise<void>::fork((Promise<void> *)&local_1b8);
      node.ptr = local_1f0.ptr;
      if (&(local_1f0.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
        local_1f0.ptr = (PromiseNode *)0x0;
        kj::_::PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
      }
      plVar4 = local_1e0;
      if (local_1e0 != (long *)0x0) {
        local_1e0 = (long *)0x0;
        (**((local_1e8.this)->super_ClientHook)._vptr_ClientHook)
                  (local_1e8.this,(long)plVar4 + *(long *)(*plVar4 + -0x10));
      }
      uVar2 = local_210._8_8_;
      if ((PromiseArena *)local_210._8_8_ != (PromiseArena *)0x0) {
        local_210._8_8_ = (PromiseArena *)0x0;
        (**(_func_int **)(((String *)local_210._0_8_)->content).ptr)
                  (local_210._0_8_,(*(_func_int ***)uVar2)[-2] + (long)(_func_int ***)uVar2);
      }
      kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)local_210);
      pDVar3 = local_200.disposer;
      local_200.disposer = (Disposer *)local_210._0_8_;
      local_210._0_8_ = (Exception *)0x0;
      if ((Exception *)pDVar3 != (Exception *)0x0) {
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pDVar3);
        uVar2 = local_210._0_8_;
        if ((Exception *)local_210._0_8_ != (Exception *)0x0) {
          local_210._0_8_ = (Exception *)0x0;
          kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar2);
        }
      }
      kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)local_210);
      kj::Promise<void>::
      detach<capnp::LocalClient::callInternal(unsigned_long,unsigned_short,capnp::CallContextHook&)::_lambda(kj::Exception&&)_1_>
                ((Promise<void> *)local_210,(anon_class_1_0_00000001_for_errorHandler *)&local_1e8);
      uVar2 = local_210._0_8_;
      if ((Exception *)local_210._0_8_ != (Exception *)0x0) {
        local_210._0_8_ = (Exception *)0x0;
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar2);
      }
      sVar6 = local_1b8.ownFile.content.size_;
      if ((ExceptionOrValue *)local_1b8.ownFile.content.size_ != (ExceptionOrValue *)0x0) {
        local_1b8.ownFile.content.size_ = 0;
        (**((PromiseArenaMember *)local_1b8.ownFile.content.ptr)->_vptr_PromiseArenaMember)
                  (local_1b8.ownFile.content.ptr,
                   &(((Maybe<kj::Exception> *)sVar6)->ptr).isSet +
                   *(long *)(*(long *)&((Maybe<kj::Exception> *)sVar6)->ptr + -0x10));
      }
    }
    if ((char)local_200.ptr == '\x01') {
      local_1b8.ownFile.content.ptr =
           (char *)kj::_::
                   TransformPromiseNode<void,_kj::_::IdentityFunc<void>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++:883:19)>
                   ::anon_class_8_1_8991fb9c_for_errorHandler::operator();
      local_1e8.this = (LocalClient *)interfaceId;
      kj::_::PromiseDisposer::
      appendPromise<kj::_::TransformPromiseNode<void,kj::_::IdentityFunc<void>,capnp::LocalClient::callInternal(unsigned_long,unsigned_short,capnp::CallContextHook&)::_lambda(kj::Exception&&)_2_>,kj::_::PromiseDisposer,kj::_::IdentityFunc<void>,capnp::LocalClient::callInternal(unsigned_long,unsigned_short,capnp::CallContextHook&)::_lambda(kj::Exception&&)_2_,void*&>
                ((PromiseDisposer *)local_210,(OwnPromiseNode *)(local_210 + 0x10),
                 (IdentityFunc<void> *)&local_1f0,&local_1e8,(void **)&local_1b8);
      *(undefined1 *)(interfaceId + 0x78) = 1;
      local_1b8.ownFile.content.ptr = (char *)interfaceId;
      kj::Promise<void>::attach<capnp::LocalClient::BlockingScope>
                ((Promise<void> *)this,(BlockingScope *)local_210);
      pcVar5 = local_1b8.ownFile.content.ptr;
      if ((PromiseNode *)local_1b8.ownFile.content.ptr != (PromiseNode *)0x0) {
        *(undefined1 *)
         &(((PromiseNode *)((long)local_1b8.ownFile.content.ptr + 0x70))->super_PromiseArenaMember).
          arena = 0;
        while ((*(char *)&(((PromiseNode *)((long)pcVar5 + 0x70))->super_PromiseArenaMember).arena
                == '\0' &&
               (this_00 = (BlockedCall *)
                          (((PromiseNode *)((long)pcVar5 + 0x210))->super_PromiseArenaMember).arena,
               this_00 != (BlockedCall *)0x0))) {
          BlockedCall::unblock(this_00);
        }
      }
      uVar2 = local_210._0_8_;
      if ((Exception *)local_210._0_8_ != (Exception *)0x0) {
        local_210._0_8_ = (Exception *)0x0;
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar2);
      }
      pDVar3 = local_200.disposer;
      if ((Exception *)local_200.disposer != (Exception *)0x0) {
        local_200.disposer = (Disposer *)0x0;
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pDVar3);
      }
    }
    else {
      (this->super_ClientHook)._vptr_ClientHook = (_func_int **)local_200.disposer;
    }
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> callInternal(uint64_t interfaceId, uint16_t methodId,
                                 CallContextHook& context) {
    KJ_ASSERT(!blocked);

    KJ_IF_SOME(e, brokenException) {
      // Previous streaming call threw, so everything fails from now on.
      return kj::cp(e);
    }

    // `server` can't be null here since `brokenException` is null.
    auto result = KJ_ASSERT_NONNULL(server)->dispatchCall(interfaceId, methodId,
                                       CallContext<AnyPointer, AnyPointer>(context));

    KJ_IF_SOME(r, revoker) {
      result.promise = r.wrap(kj::mv(result.promise));
    }

    if (!result.allowCancellation) {
      // Make sure this call cannot be canceled by forking the promise and detaching one branch.
      auto fork = result.promise.attach(kj::addRef(*this), context.addRef()).fork();
      result.promise = fork.addBranch();
      fork.addBranch().detach([](kj::Exception&&) {
        // Exception from canceled call is silently discarded. The caller should have waited for
        // it if they cared.
      });
    }

    if (result.isStreaming) {
      return result.promise
          .catch_([this](kj::Exception&& e) {
        brokenException = kj::cp(e);
        kj::throwRecoverableException(kj::mv(e));
      }).attach(BlockingScope(*this));
    } else {
      return kj::mv(result.promise);
    }
  }